

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O0

int sfp_get_sfp_plus_cable_technology(tcv_t *tcv,sfp_plus_cable_technology_t *technology)

{
  sfp_plus_cable_technology_t *technology_local;
  tcv_t *tcv_local;
  
  if (((tcv == (tcv_t *)0x0) || (technology == (sfp_plus_cable_technology_t *)0x0)) ||
     (tcv->data == (void *)0x0)) {
    tcv_local._4_4_ = -4;
  }
  else {
    technology->bmp = '\0';
    technology->bmp = (uint8_t)((int)(*(byte *)((long)tcv->data + 9) & 0xc) >> 2);
    tcv_local._4_4_ = 0;
  }
  return tcv_local._4_4_;
}

Assistant:

int sfp_get_sfp_plus_cable_technology(tcv_t *tcv, sfp_plus_cable_technology_t *technology)
{
	if (tcv == NULL || technology == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Clear bitmap */
	technology->bmp = 0;

	/* Fill bitmap */
	technology->bmp = (((sfp_data_t*)tcv->data)->a0[SFP_PLUS_TECH_REG] & SFP_PLUS_TECH_MASK) >> 2;

	return 0;
}